

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

int mtbdd_set_contains(MTBDD set,uint32_t var)

{
  long lVar1;
  uint uVar2;
  
  do {
    lVar1 = (set & 0xffffffffff) * 0x10;
    uVar2 = (uint)((ulong)*(undefined8 *)(nodes->data + lVar1 + 8) >> 0x28);
    if (uVar2 == var) {
      return 1;
    }
  } while ((uVar2 <= var) &&
          (set = set & 0x8000000000000000 ^ *(ulong *)(nodes->data + lVar1) & 0x800000ffffffffff,
          set != 0x8000000000000000));
  return 0;
}

Assistant:

int
mtbdd_set_contains(MTBDD set, uint32_t var)
{
    while (set != mtbdd_true) {
        mtbddnode_t n = MTBDD_GETNODE(set);
        uint32_t v = mtbddnode_getvariable(n);
        if (v == var) return 1;
        if (v > var) return 0;
        set = node_gethigh(set, n);
    }
    return 0;
}